

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet_reader.cc
# Opt level: O0

void __thiscall PacketReader::Recv(PacketReader *this)

{
  UdpSocket *this_00;
  QuickImpl *this_01;
  uint16_t port_00;
  int16_t data_len;
  pointer puVar1;
  uint64_t uStack_40;
  int16_t read_len;
  uint64_t received_time_microseconds;
  undefined1 local_30 [6];
  uint16_t port;
  string ip;
  PacketReader *this_local;
  
  ip.field_2._8_8_ = this;
  std::__cxx11::string::string((string *)local_30);
  received_time_microseconds._6_2_ = 0;
  uStack_40 = 0;
  while (((this->_stop ^ 0xffU) & 1) != 0) {
    this_00 = this->_socket;
    puVar1 = std::unique_ptr<unsigned_char,_std::default_delete<unsigned_char>_>::get
                       (&this->_read_buf);
    data_len = UdpSocket::Recv(this_00,(string *)local_30,
                               (uint16_t *)((long)&received_time_microseconds + 6),puVar1,0x800,
                               &stack0xffffffffffffffc0);
    port_00 = received_time_microseconds._6_2_;
    if (data_len != 0) {
      this_01 = this->_quick;
      puVar1 = std::unique_ptr<unsigned_char,_std::default_delete<unsigned_char>_>::get
                         (&this->_read_buf);
      QuickImpl::OnRecv(this_01,(string *)local_30,port_00,puVar1,data_len,uStack_40);
    }
  }
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void PacketReader::Recv()
{
	std::string ip;
	uint16_t port = 0;
	uint64_t received_time_microseconds = 0;
	while (!_stop) {
		auto read_len = _socket->Recv(ip, port, _read_buf.get(), BUF_LEN, received_time_microseconds);
		if (read_len == 0)
			continue;
		_quick->OnRecv(ip, port, _read_buf.get(), read_len, received_time_microseconds);
	}
}